

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O1

void IoTHubTransport_AMQP_Common_DoWork(TRANSPORT_LL_HANDLE handle)

{
  long lVar1;
  int iVar2;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *on_methods_error_context;
  code *pcVar3;
  AMQP_CONNECTION_HANDLE pAVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  IOTHUB_MESSAGE_LIST *message;
  CBS_HANDLE cbs_handle;
  RETRY_ACTION retry_action;
  CBS_HANDLE local_70;
  AMQP_CONNECTION_CONFIG local_68;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
               ,"IoTHubTransport_AMQP_Common_DoWork",0x58f,1,
               "IoTHubClient DoWork failed: transport handle parameter is NULL.");
    return;
  }
  if (*(int *)((long)handle + 0x40) == 7) {
    return;
  }
  if (*(int *)((long)handle + 0x40) == 4) {
    iVar2 = retry_control_should_retry
                      (*(RETRY_CONTROL_HANDLE *)((long)handle + 0x48),(RETRY_ACTION *)&local_68);
    if (iVar2 != 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                   ,"IoTHubTransport_AMQP_Common_DoWork",0x5a0,1,
                   "retry_control_should_retry() failed; assuming immediate connection retry for safety."
                  );
      }
      local_68.iothub_host_fqdn = (char *)((ulong)local_68.iothub_host_fqdn._4_4_ << 0x20);
    }
    if ((int)local_68.iothub_host_fqdn != 2) {
      if ((int)local_68.iothub_host_fqdn != 0) {
        return;
      }
      prepare_for_connection_retry((AMQP_TRANSPORT_INSTANCE *)handle);
      return;
    }
    *(undefined4 *)((long)handle + 0x40) = 7;
    singlylinkedlist_foreach
              (*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28),
               raise_connection_status_callback_retry_expired,(void *)0x0);
    return;
  }
  item_handle = singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28));
  if (item_handle == (LIST_ITEM_HANDLE)0x0) goto LAB_0012de88;
  if (*(long *)((long)handle + 0x18) == 0) {
    if (*(int *)((long)handle + 0x24) == 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar8 = 
        "Failed establishing connection (transport doesn\'t have a preferred authentication mode set; unexpected!)."
        ;
        iVar2 = 0x2f1;
LAB_0012de42:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                   ,"establish_amqp_connection",iVar2,1,pcVar8);
      }
    }
    else if ((*(long *)((long)handle + 8) == 0) &&
            (iVar2 = get_new_underlying_io_transport
                               ((AMQP_TRANSPORT_INSTANCE *)handle,(XIO_HANDLE *)((long)handle + 8)),
            iVar2 != 0)) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar8 = "Failed establishing connection (failed to obtain a TLS I/O transport layer).";
        iVar2 = 0x2f7;
        goto LAB_0012de42;
      }
    }
    else {
      local_68.iothub_host_fqdn = STRING_c_str(*handle);
      local_68.underlying_io_transport = *(XIO_HANDLE *)((long)handle + 8);
      local_68.is_trace_on = *(_Bool *)((long)handle + 0x30);
      local_68.on_state_changed_callback = on_amqp_connection_state_changed;
      local_68.svc2cl_keep_alive_timeout_secs = *(size_t *)((long)handle + 0x50);
      local_68.cl2svc_keep_alive_send_ratio = *(double *)((long)handle + 0x58);
      if (*(int *)((long)handle + 0x24) == 1) {
        local_68.create_sasl_io = true;
        local_68.create_cbs_connection = local_68.create_sasl_io;
      }
      else if (*(int *)((long)handle + 0x24) == 2) {
        local_68.create_sasl_io = false;
        local_68.create_cbs_connection = local_68.create_sasl_io;
      }
      *(undefined4 *)((long)handle + 0x20) = 2;
      *(uint *)((long)handle + 0x40) = (uint)(*(int *)((long)handle + 0x40) == 5) * 4 + 2;
      local_68.on_state_changed_context = handle;
      pAVar4 = amqp_connection_create(&local_68);
      *(AMQP_CONNECTION_HANDLE *)((long)handle + 0x18) = pAVar4;
      if (pAVar4 != (AMQP_CONNECTION_HANDLE)0x0) goto LAB_0012d60f;
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                   ,"establish_amqp_connection",0x31e,1,
                   "Failed establishing connection (failed to create the amqp_connection instance)."
                  );
      }
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar8 = "AMQP transport failed to establish connection with service.";
      iVar2 = 0x5b8;
LAB_0012de76:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"IoTHubTransport_AMQP_Common_DoWork",iVar2,1,pcVar8);
    }
  }
  else {
LAB_0012d60f:
    if (*(int *)((long)handle + 0x20) != 1) goto LAB_0012de88;
    uVar6 = 0;
    uVar9 = 0;
    do {
      on_methods_error_context = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
      if (on_methods_error_context == (undefined8 *)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                     ,"IoTHubTransport_AMQP_Common_DoWork",0x5c7,1,
                     "Transport had an unexpected failure during DoWork (failed to fetch a registered_devices list item value)"
                    );
        }
      }
      else if ((ulong)on_methods_error_context[6] < 5) {
        iVar2 = *(int *)(on_methods_error_context + 4);
        if (iVar2 - 1U < 2) {
          iVar2 = is_timeout_reached(on_methods_error_context[7],
                                     *(uint *)(on_methods_error_context + 8),(_Bool *)&local_68);
          if (iVar2 == 0) {
            iVar2 = 0;
            if ((char)local_68.iothub_host_fqdn != '\x01') goto LAB_0012dc60;
            pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x42a;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "NULL";
              }
              iVar5 = 0x428;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (device failed to start or stop within expected timeout)"
              ;
              goto LAB_0012d9a0;
            }
          }
          else {
            pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x423;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "NULL";
              }
              iVar5 = 0x421;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (failed tracking timeout of device %d state)"
              ;
LAB_0012d9a0:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"IoTHubTransport_AMQP_Common_Device_DoWork",iVar5,1,pcVar7,pcVar8);
            }
          }
          *(undefined4 *)(on_methods_error_context + 4) = 4;
        }
        else if (iVar2 == 3) {
          if ((*(char *)(on_methods_error_context + 10) == '\x01') &&
             (*(char *)((long)on_methods_error_context + 0x51) == '\0')) {
            iVar2 = amqp_connection_get_session_handle
                              (*(AMQP_CONNECTION_HANDLE *)(on_methods_error_context[2] + 0x18),
                               (SESSION_HANDLE *)&local_68);
            if (iVar2 == 0) {
              pcVar3 = on_methods_unsubscribed;
              iVar2 = iothubtransportamqp_methods_subscribe
                                ((IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)on_methods_error_context[9],
                                 (SESSION_HANDLE)local_68.iothub_host_fqdn,on_methods_error,
                                 on_methods_error_context,on_method_request_received,
                                 on_methods_error_context,on_methods_unsubscribed,
                                 on_methods_error_context);
              if (iVar2 == 0) {
                *(undefined1 *)((long)on_methods_error_context + 0x51) = 1;
                goto LAB_0012d7bd;
              }
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                iVar2 = 0x1f8;
                pcVar8 = "Cannot subscribe for methods";
                goto LAB_0012dbf9;
              }
            }
            else {
              pcVar3 = (code *)STRING_c_str((STRING_HANDLE)*on_methods_error_context);
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                if (pcVar3 == (code *)0x0) {
                  pcVar3 = (code *)0x1971c9;
                }
                iVar2 = 499;
                pcVar8 = 
                "Device \'%s\' failed subscribing for methods (failed getting session handle)";
LAB_0012dbf9:
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                           ,"subscribe_methods",iVar2,1,pcVar8,pcVar3);
              }
            }
            pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "NULL";
              }
              iVar2 = 0x44d;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (failed registering for device methods)";
LAB_0012dc4b:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"IoTHubTransport_AMQP_Common_Device_DoWork",iVar2,1,pcVar7,pcVar8);
            }
          }
          else {
LAB_0012d7bd:
            do {
              iVar2 = DList_IsListEmpty((PDLIST_ENTRY)on_methods_error_context[3]);
              if (iVar2 == 0) {
                message = (IOTHUB_MESSAGE_LIST *)
                          &(*(PDLIST_ENTRY *)on_methods_error_context[3])[-2].Blink;
                DList_RemoveEntryList(*(PDLIST_ENTRY *)on_methods_error_context[3]);
              }
              else {
                message = (IOTHUB_MESSAGE_LIST *)0x0;
              }
              if (message == (IOTHUB_MESSAGE_LIST *)0x0) {
                iVar2 = 0;
                goto LAB_0012dc60;
              }
              iVar2 = amqp_device_send_event_async
                                ((AMQP_DEVICE_HANDLE)on_methods_error_context[1],message,
                                 on_event_send_complete,on_methods_error_context);
            } while (iVar2 == 0);
            pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "NULL";
              }
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"send_pending_events",0x3e6,1,
                         "Device \'%s\' failed to send message (amqp_device_send_event_async failed)"
                         ,pcVar8);
            }
            on_event_send_complete
                      (message,D2C_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING,
                       on_methods_error_context);
            pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "NULL";
              }
              iVar2 = 0x456;
              pcVar7 = "Failed performing DoWork for device \'%s\' (failed sending pending events)";
              goto LAB_0012dc4b;
            }
          }
          on_methods_error_context[5] = on_methods_error_context[5] + 1;
          iVar2 = 0x458;
        }
        else if (iVar2 == 0) {
          local_70 = (CBS_HANDLE)0x0;
          iVar2 = amqp_connection_get_session_handle
                            (*(AMQP_CONNECTION_HANDLE *)(on_methods_error_context[2] + 0x18),
                             (SESSION_HANDLE *)&local_68);
          if (iVar2 == 0) {
            if ((*(int *)(on_methods_error_context[2] + 0x24) == 1) &&
               (iVar2 = amqp_connection_get_cbs_handle
                                  (*(AMQP_CONNECTION_HANDLE *)(on_methods_error_context[2] + 0x18),
                                   &local_70), iVar2 != 0)) {
              pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              iVar2 = 0x40d;
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = "NULL";
                }
                iVar5 = 0x40c;
                pcVar7 = 
                "Failed performing DoWork for device \'%s\' (failed to get the amqp_connection cbs_handle)"
                ;
                goto LAB_0012db13;
              }
            }
            else {
              iVar2 = amqp_device_start_async
                                ((AMQP_DEVICE_HANDLE)on_methods_error_context[1],
                                 (SESSION_HANDLE)local_68.iothub_host_fqdn,local_70);
              if (iVar2 == 0) goto LAB_0012db1d;
              pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              iVar2 = 0x413;
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = "NULL";
                }
                iVar5 = 0x412;
                pcVar7 = "Failed performing DoWork for device \'%s\' (failed to start device)";
                goto LAB_0012db13;
              }
            }
          }
          else {
            pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x406;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "NULL";
              }
              iVar5 = 0x405;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (failed to get the amqp_connection session_handle)"
              ;
LAB_0012db13:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"IoTHubTransport_AMQP_Common_Device_DoWork",iVar5,1,pcVar7,pcVar8);
            }
          }
        }
        else {
          lVar1 = on_methods_error_context[5];
          on_methods_error_context[5] = lVar1 + 1U;
          if (lVar1 + 1U < 5) {
            iVar2 = amqp_device_delayed_stop((AMQP_DEVICE_HANDLE)on_methods_error_context[1],10);
            if (iVar2 == 0) {
LAB_0012db1d:
              iVar2 = 0;
            }
            else {
              pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              iVar2 = 0x458;
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = "NULL";
                }
                iVar5 = 0x43f;
                pcVar7 = "Failed to stop reset device \'%s\' (amqp_device_stop failed)";
                goto LAB_0012db13;
              }
            }
          }
          else {
            pcVar8 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x458;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "NULL";
              }
              iVar5 = 0x439;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (device reported state %d; number of previous failures: %lu)"
              ;
              goto LAB_0012db13;
            }
          }
        }
LAB_0012dc60:
        amqp_device_do_work((AMQP_DEVICE_HANDLE)on_methods_error_context[1]);
        if (iVar2 != 0) {
          uVar9 = (uVar9 + 1) - (ulong)((ulong)on_methods_error_context[5] < 5);
        }
      }
      else {
        uVar9 = uVar9 + 1;
      }
      item_handle = singlylinkedlist_get_next_item(item_handle);
      uVar6 = uVar6 + 1;
    } while (item_handle != (LIST_ITEM_HANDLE)0x0);
    if ((uVar9 == 0) || ((float)uVar9 / (float)uVar6 < 0.0)) goto LAB_0012de88;
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar8 = "Reconnection required. %zd of %zd registered devices are failing.";
      iVar2 = 0x5dc;
      goto LAB_0012de76;
    }
  }
  *(undefined4 *)((long)handle + 0x40) = 4;
LAB_0012de88:
  if (*(AMQP_CONNECTION_HANDLE *)((long)handle + 0x18) != (AMQP_CONNECTION_HANDLE)0x0) {
    amqp_connection_do_work(*(AMQP_CONNECTION_HANDLE *)((long)handle + 0x18));
  }
  return;
}

Assistant:

void IoTHubTransport_AMQP_Common_DoWork(TRANSPORT_LL_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("IoTHubClient DoWork failed: transport handle parameter is NULL.");
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* transport_instance = (AMQP_TRANSPORT_INSTANCE*)handle;
        LIST_ITEM_HANDLE list_item;

        if (transport_instance->state == AMQP_TRANSPORT_STATE_NOT_CONNECTED_NO_MORE_RETRIES)
        {
            // Nothing to be done.
        }
        else if (transport_instance->state == AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED)
        {
            RETRY_ACTION retry_action;

            if (retry_control_should_retry(transport_instance->connection_retry_control, &retry_action) != RESULT_OK)
            {
                LogError("retry_control_should_retry() failed; assuming immediate connection retry for safety.");
                retry_action = RETRY_ACTION_RETRY_NOW;
            }

            if (retry_action == RETRY_ACTION_RETRY_NOW)
            {
                prepare_for_connection_retry(transport_instance);
            }
            else if (retry_action == RETRY_ACTION_STOP_RETRYING)
            {
                update_state(transport_instance, AMQP_TRANSPORT_STATE_NOT_CONNECTED_NO_MORE_RETRIES);

                (void)singlylinkedlist_foreach(transport_instance->registered_devices, raise_connection_status_callback_retry_expired, NULL);
            }
        }
        else
        {
            if ((list_item = singlylinkedlist_get_head_item(transport_instance->registered_devices)) != NULL)
            {
                // We need to check if there are devices, otherwise the amqp_connection won't be able to be created since
                // there is not a preferred authentication mode set yet on the transport.

                if (transport_instance->amqp_connection == NULL && establish_amqp_connection(transport_instance) != RESULT_OK)
                {
                    LogError("AMQP transport failed to establish connection with service.");

                    update_state(transport_instance, AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED);
                }
                else if (transport_instance->amqp_connection_state == AMQP_CONNECTION_STATE_OPENED)
                {
                    size_t number_of_devices = 0;
                    size_t number_of_faulty_devices = 0;

                    while (list_item != NULL)
                    {
                        AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device;

                        if ((registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item)) == NULL)
                        {
                            LogError("Transport had an unexpected failure during DoWork (failed to fetch a registered_devices list item value)");
                        }
                        else if (registered_device->number_of_send_event_complete_failures >= DEVICE_FAILURE_COUNT_RECONNECTION_THRESHOLD)
                        {
                            number_of_faulty_devices++;
                        }
                        else if (IoTHubTransport_AMQP_Common_Device_DoWork(registered_device) != RESULT_OK)
                        {
                            if (registered_device->number_of_previous_failures >= DEVICE_FAILURE_COUNT_RECONNECTION_THRESHOLD)
                            {
                                number_of_faulty_devices++;
                            }
                        }

                        list_item = singlylinkedlist_get_next_item(list_item);
                        number_of_devices++;
                    }

                    if (number_of_faulty_devices > 0 &&
                        ((float)number_of_faulty_devices/(float)number_of_devices) >= DEVICE_MULTIPLEXING_FAULTY_DEVICE_RATIO_RECONNECTION_THRESHOLD)
                    {
                        LogError("Reconnection required. %zd of %zd registered devices are failing.", number_of_faulty_devices, number_of_devices);

                        update_state(transport_instance, AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED);
                    }
                }
            }

            if (transport_instance->amqp_connection != NULL)
            {
                amqp_connection_do_work(transport_instance->amqp_connection);
            }
        }
    }
}